

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O3

void chrono::
     _ReportAllContactsRollingNSC<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
               (list<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                *contactlist,ReportContactCallbackNSC *mcallback)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  _List_node_base *p_Var4;
  long local_70;
  long local_68;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  
  p_Var4 = (_List_node_base *)contactlist;
  do {
    p_Var4 = (((_List_base<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)contactlist) {
      return;
    }
    plVar1 = (long *)p_Var4[1]._M_next;
    local_68 = plVar1[0x16];
    local_70 = plVar1[0x17];
    (**(code **)(*plVar1 + 0x10))(local_48);
    (**(code **)(*(long *)p_Var4[1]._M_next + 0x98))(local_60);
    lVar2 = (long)p_Var4[1]._M_next;
    iVar3 = (*mcallback->_vptr_ReportContactCallbackNSC[2])
                      (mcallback,plVar1 + 4,plVar1 + 7,plVar1 + 0xd,&local_68,&local_70,local_48,
                       local_60,*(undefined8 *)(lVar2 + 0x10),*(undefined8 *)(lVar2 + 0x18),
                       *(undefined4 *)(lVar2 + 0x110));
  } while ((char)iVar3 != '\0');
  return;
}

Assistant:

void _ReportAllContactsRollingNSC(std::list<Tcont*>& contactlist, ChContactContainerNSC::ReportContactCallbackNSC* mcallback) {
    typename std::list<Tcont*>::iterator itercontact = contactlist.begin();
    while (itercontact != contactlist.end()) {
        bool proceed = mcallback->OnReportContact(
            (*itercontact)->GetContactP1(), (*itercontact)->GetContactP2(), (*itercontact)->GetContactPlane(),
            (*itercontact)->GetContactDistance(), (*itercontact)->GetEffectiveCurvatureRadius(),
            (*itercontact)->GetContactForce(), (*itercontact)->GetContactTorque(), (*itercontact)->GetObjA(),
            (*itercontact)->GetObjB(),
            (*itercontact)->GetConstraintNx()->GetOffset());
        if (!proceed)
            break;
        ++itercontact;
    }
}